

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

ssize_t __thiscall vox::XYZI::write(XYZI *this,int __fd,void *__buf,size_t __n)

{
  pointer __ptr;
  int iVar1;
  size_t sVar2;
  int iVar3;
  undefined4 in_register_00000034;
  FILE *__s;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  undefined4 local_24;
  undefined8 local_20;
  long local_18;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_24 = 0x495a5958;
  fwrite(&local_24,4,1,__s);
  iVar1 = *(int *)&(this->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
          *(int *)&(this->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  this->numVoxels = iVar3 >> 2;
  local_18 = (long)(iVar3 >> 2) * 4 + 4;
  fwrite(&local_18,4,1,__s);
  local_20 = 0;
  fwrite(&local_20,4,1,__s);
  fwrite(this,4,1,__s);
  __ptr = (this->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar2 = fwrite(__ptr,1,(long)(this->voxels).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)__ptr,__s);
  return sVar2;
}

Assistant:

void XYZI::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('X', 'Y', 'Z', 'I');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&numVoxels, sizeof(int32_t), 1, fp);
    fwrite(voxels.data(), sizeof(uint8_t), voxels.size(), fp);
}